

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_set_covered_faces
               (Array<MultiFab_*,_3> *umac,int scomp,int ncomp,
               Vector<double,_std::allocator<double>_> *a_vals)

{
  long lVar1;
  int iVar2;
  pointer __src;
  Array<MultiFab_*,_3> *pAVar3;
  EBFArrayBoxFactory *this;
  long lVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  size_t __n;
  double *pdVar8;
  int k;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int j_1;
  long local_2e8;
  Box local_2a4;
  Box local_288;
  Box local_26c;
  Array<MultiFab_*,_3> *local_250;
  Array4<double> local_248;
  FabArray<amrex::EBCellFlagFab> *local_208;
  Array4<double> local_200;
  Array4<double> local_1c0;
  DeviceVector<Real> vals_dv;
  Array<const_MultiCutFab_*,_3> local_168;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  local_250 = umac;
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                        &EBFArrayBoxFactory::typeinfo,0);
  if (this != (EBFArrayBoxFactory *)0x0) {
    EBFArrayBoxFactory::getAreaFrac(&local_168,this);
    local_208 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
    PODVector<double,_std::allocator<double>_>::PODVector
              (&vals_dv,(long)(a_vals->super_vector<double,_std::allocator<double>_>).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3);
    __src = (a_vals->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
    __n = (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)__src;
    if (__n != 0) {
      memcpy(vals_dv.m_data,__src,__n);
    }
    MFIter::MFIter(&mfi,(FabArrayBase *)local_250->_M_elems[0],true);
    lVar4 = (long)scomp;
    lVar6 = (long)(ncomp + scomp);
    lVar1 = lVar4 * 8;
    while (mfi.currentIndex < mfi.endIndex) {
      local_248.p = (double *)0x1;
      local_248.jstride._0_4_ = 0;
      MFIter::tilebox(&local_26c,&mfi,(IntVect *)&local_248);
      local_248.p = (double *)0x100000000;
      local_248.jstride._0_4_ = 0;
      MFIter::tilebox(&local_288,&mfi,(IntVect *)&local_248);
      local_248.p = (double *)0x0;
      local_248.jstride._0_4_ = 1;
      MFIter::tilebox(&local_2a4,&mfi,(IntVect *)&local_248);
      pAVar3 = local_250;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_248,&local_250->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1c0,&pAVar3->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_200,&pAVar3->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
      piVar5 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar5 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      iVar2 = *(int *)&((local_208->m_fabs_v).
                        super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[*piVar5]->
                       super_BaseFab<amrex::EBCellFlag>).field_0x44;
      if (iVar2 == 1) {
        MultiCutFab::const_array(&local_d0,local_168._M_elems[0],&mfi);
        MultiCutFab::const_array(&local_110,local_168._M_elems[1],&mfi);
        MultiCutFab::const_array(&local_150,local_168._M_elems[2],&mfi);
        lVar10 = (long)local_26c.smallend.vect[0];
        local_2e8 = lVar1;
        for (lVar9 = lVar4; lVar7 = (long)local_26c.smallend.vect[2], lVar9 < lVar6;
            lVar9 = lVar9 + 1) {
          for (; lVar12 = (long)local_26c.smallend.vect[1], (int)lVar7 <= local_26c.bigend.vect[2];
              lVar7 = lVar7 + 1) {
            for (; (int)lVar12 <= local_26c.bigend.vect[1]; lVar12 = lVar12 + 1) {
              for (lVar11 = 0; lVar10 + lVar11 <= (long)local_26c.bigend.vect[0];
                  lVar11 = lVar11 + 1) {
                if ((local_d0.p
                     [lVar10 + (((lVar12 - local_d0.begin.y) * local_d0.jstride +
                                (lVar7 - local_d0.begin.z) * local_d0.kstride + lVar11) -
                               (long)local_d0.begin.x)] == 0.0) &&
                   (!NAN(local_d0.p
                         [lVar10 + (((lVar12 - local_d0.begin.y) * local_d0.jstride +
                                    (lVar7 - local_d0.begin.z) * local_d0.kstride + lVar11) -
                                   (long)local_d0.begin.x)]))) {
                  *(double *)
                   ((long)local_248.p +
                   lVar11 * 8 +
                   local_248.nstride * local_2e8 +
                   (lVar12 - local_248.begin.y) *
                   CONCAT44(local_248.jstride._4_4_,(undefined4)local_248.jstride) * 8 +
                   (lVar7 - local_248.begin.z) * local_248.kstride * 8 +
                   (long)local_248.begin.x * -8 + lVar10 * 8) = vals_dv.m_data[lVar9];
                }
              }
            }
          }
          local_2e8 = local_2e8 + 8;
        }
        lVar10 = (long)local_288.smallend.vect[0];
        local_2e8 = lVar1;
        for (lVar9 = lVar4; lVar7 = (long)local_288.smallend.vect[2], lVar9 < lVar6;
            lVar9 = lVar9 + 1) {
          for (; lVar12 = (long)local_288.smallend.vect[1], (int)lVar7 <= local_288.bigend.vect[2];
              lVar7 = lVar7 + 1) {
            for (; (int)lVar12 <= local_288.bigend.vect[1]; lVar12 = lVar12 + 1) {
              for (lVar11 = 0; lVar10 + lVar11 <= (long)local_288.bigend.vect[0];
                  lVar11 = lVar11 + 1) {
                if ((local_110.p
                     [lVar10 + (((lVar12 - local_110.begin.y) * local_110.jstride +
                                (lVar7 - local_110.begin.z) * local_110.kstride + lVar11) -
                               (long)local_110.begin.x)] == 0.0) &&
                   (!NAN(local_110.p
                         [lVar10 + (((lVar12 - local_110.begin.y) * local_110.jstride +
                                    (lVar7 - local_110.begin.z) * local_110.kstride + lVar11) -
                                   (long)local_110.begin.x)]))) {
                  *(double *)
                   ((long)local_1c0.p +
                   lVar11 * 8 +
                   local_1c0.nstride * local_2e8 +
                   (lVar12 - local_1c0.begin.y) * local_1c0.jstride * 8 +
                   (lVar7 - local_1c0.begin.z) * local_1c0.kstride * 8 +
                   (long)local_1c0.begin.x * -8 + lVar10 * 8) = vals_dv.m_data[lVar9];
                }
              }
            }
          }
          local_2e8 = local_2e8 + 8;
        }
        lVar10 = (long)local_2a4.smallend.vect[0];
        local_2e8 = lVar1;
        for (lVar9 = lVar4; lVar7 = (long)local_2a4.smallend.vect[2], lVar9 < lVar6;
            lVar9 = lVar9 + 1) {
          for (; lVar12 = (long)local_2a4.smallend.vect[1], (int)lVar7 <= local_2a4.bigend.vect[2];
              lVar7 = lVar7 + 1) {
            for (; (int)lVar12 <= local_2a4.bigend.vect[1]; lVar12 = lVar12 + 1) {
              for (lVar11 = 0; lVar10 + lVar11 <= (long)local_2a4.bigend.vect[0];
                  lVar11 = lVar11 + 1) {
                if ((local_150.p
                     [lVar10 + (((lVar12 - local_150.begin.y) * local_150.jstride +
                                (lVar7 - local_150.begin.z) * local_150.kstride + lVar11) -
                               (long)local_150.begin.x)] == 0.0) &&
                   (!NAN(local_150.p
                         [lVar10 + (((lVar12 - local_150.begin.y) * local_150.jstride +
                                    (lVar7 - local_150.begin.z) * local_150.kstride + lVar11) -
                                   (long)local_150.begin.x)]))) {
                  *(double *)
                   ((long)local_200.p +
                   lVar11 * 8 +
                   local_200.nstride * local_2e8 +
                   (lVar12 - local_200.begin.y) * local_200.jstride * 8 +
                   (lVar7 - local_200.begin.z) * local_200.kstride * 8 +
                   (long)local_200.begin.x * -8 + lVar10 * 8) = vals_dv.m_data[lVar9];
                }
              }
            }
          }
          local_2e8 = local_2e8 + 8;
        }
      }
      else if (iVar2 == -1) {
        lVar9 = lVar1;
        for (lVar10 = lVar4; lVar7 = (long)local_26c.smallend.vect[2], lVar10 < lVar6;
            lVar10 = lVar10 + 1) {
          for (; lVar12 = (long)local_26c.smallend.vect[1], (int)lVar7 <= local_26c.bigend.vect[2];
              lVar7 = lVar7 + 1) {
            for (; (int)lVar12 <= local_26c.bigend.vect[1]; lVar12 = lVar12 + 1) {
              pdVar8 = (double *)
                       ((long)local_248.p +
                       local_248.nstride * lVar9 +
                       (lVar7 - local_248.begin.z) * local_248.kstride * 8 +
                       (lVar12 - local_248.begin.y) *
                       CONCAT44(local_248.jstride._4_4_,(undefined4)local_248.jstride) * 8 +
                       (long)local_248.begin.x * -8 + (long)local_26c.smallend.vect[0] * 8);
              for (lVar11 = (long)local_26c.smallend.vect[0]; lVar11 <= local_26c.bigend.vect[0];
                  lVar11 = lVar11 + 1) {
                *pdVar8 = vals_dv.m_data[lVar10];
                pdVar8 = pdVar8 + 1;
              }
            }
          }
          lVar9 = lVar9 + 8;
        }
        lVar9 = lVar1;
        for (lVar10 = lVar4; lVar7 = (long)local_288.smallend.vect[2], lVar10 < lVar6;
            lVar10 = lVar10 + 1) {
          for (; lVar12 = (long)local_288.smallend.vect[1], (int)lVar7 <= local_288.bigend.vect[2];
              lVar7 = lVar7 + 1) {
            for (; (int)lVar12 <= local_288.bigend.vect[1]; lVar12 = lVar12 + 1) {
              pdVar8 = (double *)
                       ((long)local_1c0.p +
                       local_1c0.nstride * lVar9 +
                       (lVar7 - local_1c0.begin.z) * local_1c0.kstride * 8 +
                       (lVar12 - local_1c0.begin.y) * local_1c0.jstride * 8 +
                       (long)local_1c0.begin.x * -8 + (long)local_288.smallend.vect[0] * 8);
              for (lVar11 = (long)local_288.smallend.vect[0]; lVar11 <= local_288.bigend.vect[0];
                  lVar11 = lVar11 + 1) {
                *pdVar8 = vals_dv.m_data[lVar10];
                pdVar8 = pdVar8 + 1;
              }
            }
          }
          lVar9 = lVar9 + 8;
        }
        lVar9 = lVar1;
        for (lVar10 = lVar4; lVar7 = (long)local_2a4.smallend.vect[2], lVar10 < lVar6;
            lVar10 = lVar10 + 1) {
          for (; lVar12 = (long)local_2a4.smallend.vect[1], (int)lVar7 <= local_2a4.bigend.vect[2];
              lVar7 = lVar7 + 1) {
            for (; (int)lVar12 <= local_2a4.bigend.vect[1]; lVar12 = lVar12 + 1) {
              pdVar8 = (double *)
                       ((long)local_200.p +
                       local_200.nstride * lVar9 +
                       (lVar7 - local_200.begin.z) * local_200.kstride * 8 +
                       (lVar12 - local_200.begin.y) * local_200.jstride * 8 +
                       (long)local_200.begin.x * -8 + (long)local_2a4.smallend.vect[0] * 8);
              for (lVar11 = (long)local_2a4.smallend.vect[0]; lVar11 <= local_2a4.bigend.vect[0];
                  lVar11 = lVar11 + 1) {
                *pdVar8 = vals_dv.m_data[lVar10];
                pdVar8 = pdVar8 + 1;
              }
            }
          }
          lVar9 = lVar9 + 8;
        }
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    PODVector<double,_std::allocator<double>_>::~PODVector(&vals_dv);
  }
  return;
}

Assistant:

void
EB_set_covered_faces (const Array<MultiFab*,AMREX_SPACEDIM>& umac, const int scomp, const int ncomp, const Vector<Real>& a_vals )
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(umac[0]->Factory()));
    if (factory == nullptr) return;

    const auto& area = factory->getAreaFrac();
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ASSERT(umac[0]->nComp() >= scomp+ncomp);

    Gpu::DeviceVector<Real> vals_dv(a_vals.size());
    Gpu::copy(Gpu::hostToDevice, a_vals.begin(), a_vals.end(), vals_dv.begin());
    Real const* AMREX_RESTRICT vals = vals_dv.data();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*umac[0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        AMREX_D_TERM(const Box& xbx = mfi.tilebox(IntVect::TheDimensionVector(0));,
                     const Box& ybx = mfi.tilebox(IntVect::TheDimensionVector(1));,
                     const Box& zbx = mfi.tilebox(IntVect::TheDimensionVector(2)));
        AMREX_D_TERM(Array4<Real> const& u = umac[0]->array(mfi);,
                     Array4<Real> const& v = umac[1]->array(mfi);,
                     Array4<Real> const& w = umac[2]->array(mfi));

        auto fabtyp = flags[mfi].getType();
        if (fabtyp == FabType::covered)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            u(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            v(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            w(i,j,k,n) = vals[n];
                        }}}
                    }
                }
            );
        }
        else if (fabtyp == FabType::singlevalued)
        {
            AMREX_D_TERM(Array4<Real const> const& ax = area[0]->const_array(mfi);,
                         Array4<Real const> const& ay = area[1]->const_array(mfi);,
                         Array4<Real const> const& az = area[2]->const_array(mfi));
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ax(i,j,k) == 0.0) u(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ay(i,j,k) == 0.0) v(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (az(i,j,k) == 0.0) w(i,j,k,n) = vals[n];
                        }}}
                    }
                }
            );
        }
    }
}